

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_1e550::time_zone_setter::time_zone_setter(time_zone_setter *this,czstring tz)

{
  not_null<const_char_*> local_20;
  char *local_18;
  czstring tz_local;
  time_zone_setter *this_local;
  
  local_18 = tz;
  tz_local = (czstring)this;
  (anonymous_namespace)::time_zone_setter::tz_value_abi_cxx11_();
  pstore::gsl::not_null<const_char_*>::not_null(&local_20,local_18);
  set_tz(local_20);
  return;
}

Assistant:

time_zone_setter::time_zone_setter (czstring tz)
            : old_ (time_zone_setter::tz_value ()) {
        time_zone_setter::set_tz (tz);
    }